

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

void raviH_free(lua_State *L,RaviArray *t)

{
  if ((t->flags & 4) != 0) {
    if ((t->flags & 1) != 0) {
      __assert_fail("(t->flags & RAVI_ARRAY_SLICE) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x21d,"void raviH_free(lua_State *, RaviArray *)");
    }
    luaM_realloc_(L,t->data,(ulong)t->size << 3,0);
  }
  luaM_realloc_(L,t,0x40,0);
  return;
}

Assistant:

void raviH_free(lua_State *L, RaviArray *t) {
  if (t->flags & RAVI_ARRAY_ALLOCATED) {
    // slices will never have allocated flag set
    lua_assert((t->flags & RAVI_ARRAY_SLICE) == 0);
    if (t->flags & RAVI_ARRAY_ISFLOAT)
      luaM_freemem(L, t->data, (t->size * sizeof(lua_Number)));
    else {
      luaM_freemem(L, t->data, (t->size * sizeof(lua_Integer)));
    }
  }
  luaM_free(L, t);
}